

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildLong1Float1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot)

{
  code *pcVar1;
  IRType IVar2;
  bool bVar3;
  OpCode opcode;
  RegOpnd *src1Opnd;
  RegOpnd *pRVar4;
  RegOpnd *dstOpnd;
  undefined4 *puVar5;
  Instr *pIVar6;
  undefined6 in_register_00000032;
  
  src1Opnd = BuildSrcOpnd(this,src1RegSlot,TyFloat32);
  pRVar4 = src1Opnd;
  switch((int)CONCAT62(in_register_00000032,newOpcode)) {
  case 0x110:
    IVar2 = TyInt64;
    break;
  case 0x111:
    IVar2 = TyUint64;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xd41,"((0))","(0)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    opcode = Nop;
    dstOpnd = (RegOpnd *)0x0;
    goto LAB_004bdcc1;
  case 0x118:
    IVar2 = TyInt64;
    goto LAB_004bdc56;
  case 0x119:
    IVar2 = TyUint64;
LAB_004bdc56:
    dstOpnd = BuildDstOpnd(this,dstRegSlot,IVar2);
    opcode = Conv_Prim_Sat;
    goto LAB_004bdcc1;
  }
  dstOpnd = BuildDstOpnd(this,dstRegSlot,IVar2);
  pRVar4 = IR::RegOpnd::New((src1Opnd->super_Opnd).m_type,this->m_func);
  IR::Opnd::SetValueType(&pRVar4->super_Opnd,(ValueType)0x108);
  pIVar6 = IR::Instr::New(TrapIfTruncOverflow,&pRVar4->super_Opnd,&src1Opnd->super_Opnd,this->m_func
                         );
  AddInstr(this,pIVar6,offset);
  dstOpnd->field_0x18 = dstOpnd->field_0x18 | 4;
  opcode = Conv_Prim;
LAB_004bdcc1:
  pIVar6 = IR::Instr::New(opcode,&dstOpnd->super_Opnd,&pRVar4->super_Opnd,this->m_func);
  AddInstr(this,pIVar6,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildLong1Float1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(src1RegSlot, TyFloat32);
    IR::RegOpnd * dstOpnd = nullptr;
    Js::OpCode op = Js::OpCode::Nop;
    bool trapping = false;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Conv_Check_FTL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
        op = Js::OpCode::Conv_Prim;
        trapping = true;
        break;
    case Js::OpCodeAsmJs::Conv_Check_FTUL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint64);
        op = Js::OpCode::Conv_Prim;
        trapping = true;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTUL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint64);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    default:
        Assume(UNREACHED);
    }

    if (trapping)
    {
        IR::RegOpnd* tmpDst = IR::RegOpnd::New(srcOpnd->GetType(), m_func);
        tmpDst->SetValueType(ValueType::Float);
        AddInstr(IR::Instr::New(Js::OpCode::TrapIfTruncOverflow, tmpDst, srcOpnd, m_func), offset);
        dstOpnd->m_dontDeadStore = true;
        srcOpnd = tmpDst;
    }
    IR::Instr * instr = IR::Instr::New(op, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}